

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroup::TemplatedScan<(duckdb::TableScanType)0>
          (RowGroup *this,TransactionData transaction,CollectionScanState *state,DataChunk *result)

{
  RandomEngine *this_00;
  SelectionVector *sel_vector;
  double *pdVar1;
  BlockManager *pBVar2;
  pointer pSVar3;
  size_type __n;
  data_ptr_t pdVar4;
  _Head_base<0UL,_duckdb::ColumnScanState_*,_false> _Var5;
  double dVar6;
  ScanFilterInfo *pSVar7;
  bool bVar8;
  bool bVar9;
  FilterPropagateResult FVar10;
  int iVar11;
  idx_t iVar12;
  const_reference pvVar13;
  ColumnData *pCVar14;
  AdaptiveFilterState state_00;
  AdaptiveFilter *this_01;
  reference pvVar15;
  const_reference pvVar16;
  type filter_state;
  reference pvVar17;
  ulong uVar18;
  const_iterator __begin5;
  pointer pSVar19;
  idx_t iVar20;
  ulong uVar21;
  long lVar22;
  idx_t i;
  ulong uVar23;
  ulong uVar24;
  idx_t approved_tuple_count;
  DataChunk *local_128;
  CollectionScanState *local_120;
  TableScanState *local_118;
  ScanFilterInfo *local_110;
  idx_t local_108;
  vector<duckdb::StorageIndex,_true> *local_100;
  SelectionVector sel;
  optional_ptr<duckdb::AdaptiveFilter,_true> adaptive_filter;
  PrefetchState prefetch_state;
  
  local_118 = state->parent;
  local_100 = &local_118->column_ids;
  local_110 = &local_118->filters;
  this_00 = &state->random;
  sel_vector = &state->valid_sel;
  pSVar7 = &local_118->filters;
  local_128 = result;
  local_120 = state;
  do {
    uVar24 = state->vector_index * 0x800;
    iVar20 = state->max_row_group_row + state->vector_index * -0x800;
    if (state->max_row_group_row < uVar24 || iVar20 == 0) {
      return;
    }
    if (0x7ff < iVar20) {
      iVar20 = 0x800;
    }
    if (((state->parent->sampling_info).do_system_sample != true) ||
       (dVar6 = RandomEngine::NextRandom(this_00),
       pdVar1 = &(state->parent->sampling_info).sample_rate, dVar6 < *pdVar1 || dVar6 == *pdVar1)) {
      bVar8 = CheckZonemapSegments(this,state);
      bVar9 = true;
      if (bVar8) {
        iVar12 = GetSelVector(state->row_group,transaction,state->vector_index,sel_vector,iVar20);
        if (iVar12 == 0) goto LAB_01566b42;
        pBVar2 = ((this->collection)._M_data)->block_manager;
        local_108 = iVar12;
        iVar11 = (*pBVar2->_vptr_BlockManager[0x12])(pBVar2);
        if ((char)iVar11 != '\0') {
          prefetch_state.blocks.
          super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          .
          super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          prefetch_state.blocks.
          super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          .
          super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          prefetch_state.blocks.
          super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          .
          super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          lVar22 = 0;
          for (uVar23 = 0;
              uVar23 < (ulong)((long)(local_118->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_118->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar23 = uVar23 + 1) {
            pvVar13 = vector<duckdb::StorageIndex,_true>::get<true>(local_100,uVar23);
            if (pvVar13->index != 0xffffffffffffffff) {
              pCVar14 = GetColumn(this,pvVar13);
              (*pCVar14->_vptr_ColumnData[6])
                        (pCVar14,&prefetch_state,
                         (long)&((state->column_scans).
                                 super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                 .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>.
                                _M_head_impl)->current + lVar22,iVar20);
            }
            lVar22 = lVar22 + 0x98;
          }
          (*pBVar2->buffer_manager->_vptr_BufferManager[8])(pBVar2->buffer_manager,&prefetch_state);
          PrefetchState::~PrefetchState(&prefetch_state);
        }
        bVar9 = ScanFilterInfo::HasFilters(local_110);
        if (local_108 == iVar20 && !bVar9) {
          lVar22 = 0;
          for (uVar23 = 0;
              uVar23 < (ulong)((long)(local_118->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_118->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar23 = uVar23 + 1) {
            pvVar13 = vector<duckdb::StorageIndex,_true>::get<true>(local_100,uVar23);
            if (pvVar13->index == 0xffffffffffffffff) {
              pvVar17 = vector<duckdb::Vector,_true>::get<true>(&local_128->data,uVar23);
              Vector::Sequence(pvVar17,(this->super_SegmentBase<duckdb::RowGroup>).start + uVar24,1,
                               iVar20);
            }
            else {
              pCVar14 = GetColumn(this,pvVar13);
              iVar12 = local_120->vector_index;
              _Var5._M_head_impl =
                   (local_120->column_scans).
                   super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                   .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
              pvVar17 = vector<duckdb::Vector,_true>::get<true>(&local_128->data,uVar23);
              state = local_120;
              prefetch_state.blocks.
              super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
              .
              super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)transaction.start_time;
              prefetch_state.blocks.
              super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
              .
              super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)transaction.transaction.ptr;
              prefetch_state.blocks.
              super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
              .
              super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)transaction.transaction_id;
              uVar18 = (pCVar14->count).super___atomic_base<unsigned_long>._M_i + iVar12 * -0x800;
              if (0x7ff < uVar18) {
                uVar18 = 0x800;
              }
              (*pCVar14->_vptr_ColumnData[9])
                        (pCVar14,iVar12,(long)&(_Var5._M_head_impl)->current + lVar22,pvVar17,uVar18
                         ,pCVar14->_vptr_ColumnData,transaction.transaction.ptr._0_4_,
                         (undefined4)transaction.transaction_id,transaction.start_time);
            }
            lVar22 = lVar22 + 0x98;
          }
LAB_0156716d:
          local_108 = iVar20;
          local_128->count = local_108;
          state->vector_index = state->vector_index + 1;
          return;
        }
        sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        approved_tuple_count = local_108;
        sel.sel_vector = (sel_t *)0x0;
        sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        if (local_108 == iVar20) {
          ::std::__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>::reset
                    ((__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> *)
                     &sel.selection_data);
          sel.sel_vector = (sel_t *)0x0;
        }
        else {
          SelectionVector::Initialize(&sel,sel_vector);
        }
        adaptive_filter.ptr =
             (local_118->filters).adaptive_filter.
             super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>
             .super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl;
        state_00 = ScanFilterInfo::BeginFilter(local_110);
        if (bVar9) {
          uVar23 = 0;
          while( true ) {
            pSVar19 = (local_118->filters).filter_list.
                      super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                      super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pSVar3 = (local_118->filters).filter_list.
                     super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                     super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if ((ulong)(((long)pSVar3 - (long)pSVar19) / 0x28) <= uVar23) break;
            this_01 = optional_ptr<duckdb::AdaptiveFilter,_true>::operator->(&adaptive_filter);
            pvVar15 = vector<unsigned_long,_true>::get<true>(&this_01->permutation,uVar23);
            pvVar16 = vector<duckdb::ScanFilter,_true>::get<true>(&pSVar7->filter_list,*pvVar15);
            if (pvVar16->always_true == false) {
              filter_state = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                             ::operator*(&pvVar16->filter_state);
              __n = pvVar16->scan_column_index;
              iVar12 = pvVar16->table_column_index;
              pvVar17 = vector<duckdb::Vector,_true>::get<true>(&local_128->data,__n);
              if (iVar12 == 0xffffffffffffffff) {
                iVar12 = (this->super_SegmentBase<duckdb::RowGroup>).start + uVar24;
                FVar10 = CheckRowIdFilter(pvVar16->filter,iVar12,iVar12 + iVar20);
                if (FVar10 == FILTER_ALWAYS_FALSE) {
                  approved_tuple_count = 0;
                }
                else {
                  Vector::SetVectorType(pvVar17,FLAT_VECTOR);
                  pdVar4 = pvVar17->data;
                  for (uVar18 = 0; uVar18 < approved_tuple_count; uVar18 = uVar18 + 1) {
                    uVar21 = uVar18;
                    if (sel.sel_vector != (sel_t *)0x0) {
                      uVar21 = (ulong)sel.sel_vector[uVar18];
                    }
                    *(idx_t *)(pdVar4 + uVar21 * 8) =
                         (this->super_SegmentBase<duckdb::RowGroup>).start + uVar24 + uVar21;
                  }
                  if (FVar10 != FILTER_ALWAYS_TRUE) {
                    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&prefetch_state)
                    ;
                    Vector::ToUnifiedFormat
                              (pvVar17,approved_tuple_count,(UnifiedVectorFormat *)&prefetch_state);
                    ColumnSegment::FilterSelection
                              (&sel,pvVar17,(UnifiedVectorFormat *)&prefetch_state,pvVar16->filter,
                               filter_state,approved_tuple_count,&approved_tuple_count);
                    UnifiedVectorFormat::~UnifiedVectorFormat
                              ((UnifiedVectorFormat *)&prefetch_state);
                  }
                }
              }
              else {
                pCVar14 = GetColumn(this,pvVar16->table_column_index);
                (*pCVar14->_vptr_ColumnData[0xd])
                          (pCVar14,local_120->vector_index,
                           (local_120->column_scans).
                           super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                           .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl +
                           __n,pvVar17,&sel,&approved_tuple_count,transaction.transaction.ptr._0_4_,
                           (undefined4)transaction.transaction_id,transaction.start_time,
                           pvVar16->filter,filter_state);
              }
            }
            uVar23 = uVar23 + 1;
            state = local_120;
          }
          for (; pSVar19 != pSVar3; pSVar19 = pSVar19 + 1) {
            if (pSVar19->always_true == false) {
              pvVar17 = vector<duckdb::Vector,_true>::get<true>
                                  (&local_128->data,pSVar19->scan_column_index);
              Vector::Slice(pvVar17,&sel,approved_tuple_count);
            }
          }
        }
        iVar12 = approved_tuple_count;
        if (approved_tuple_count == 0) {
          DataChunk::Reset(local_128);
          lVar22 = 0;
          for (uVar24 = 0;
              uVar24 < (ulong)((long)(local_118->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_118->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar24 = uVar24 + 1) {
            pvVar13 = vector<duckdb::StorageIndex,_true>::get<true>(local_100,uVar24);
            if ((pvVar13->index != 0xffffffffffffffff) &&
               ((!bVar9 || (bVar8 = ScanFilterInfo::ColumnHasFilters(local_110,uVar24), !bVar8)))) {
              pCVar14 = GetColumn(this,pvVar13);
              (*pCVar14->_vptr_ColumnData[0x10])
                        (pCVar14,(long)&((state->column_scans).
                                         super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                         ._M_t.
                                         super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                         .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>.
                                        _M_head_impl)->current + lVar22,0x800);
            }
            lVar22 = lVar22 + 0x98;
          }
          state->vector_index = state->vector_index + 1;
          bVar9 = true;
        }
        else {
          for (uVar23 = 0;
              uVar23 < (ulong)((long)(local_118->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_118->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar23 = uVar23 + 1) {
            if ((!bVar9) || (bVar8 = ScanFilterInfo::ColumnHasFilters(local_110,uVar23), !bVar8)) {
              pvVar13 = vector<duckdb::StorageIndex,_true>::get<true>(local_100,uVar23);
              if (pvVar13->index == 0xffffffffffffffff) {
                pvVar17 = vector<duckdb::Vector,_true>::get<true>(&local_128->data,uVar23);
                Vector::SetVectorType(pvVar17,FLAT_VECTOR);
                pvVar17 = vector<duckdb::Vector,_true>::get<true>(&local_128->data,uVar23);
                pdVar4 = pvVar17->data;
                for (uVar18 = 0; uVar18 < approved_tuple_count; uVar18 = uVar18 + 1) {
                  uVar21 = uVar18;
                  if (sel.sel_vector != (sel_t *)0x0) {
                    uVar21 = (ulong)sel.sel_vector[uVar18];
                  }
                  *(idx_t *)(pdVar4 + uVar18 * 8) =
                       (this->super_SegmentBase<duckdb::RowGroup>).start + uVar24 + uVar21;
                }
              }
              else {
                pCVar14 = GetColumn(this,pvVar13);
                iVar20 = local_120->vector_index;
                _Var5._M_head_impl =
                     (local_120->column_scans).
                     super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                     .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
                pvVar17 = vector<duckdb::Vector,_true>::get<true>(&local_128->data,uVar23);
                (*pCVar14->_vptr_ColumnData[0xe])
                          (pCVar14,iVar20,_Var5._M_head_impl + uVar23,pvVar17,&sel,
                           approved_tuple_count,transaction.transaction.ptr._0_4_,
                           (undefined4)transaction.transaction_id,transaction.start_time);
              }
            }
          }
          ScanFilterInfo::EndFilter(local_110,state_00);
          bVar9 = false;
          local_108 = approved_tuple_count;
          state = local_120;
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&sel.selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        iVar20 = local_108;
        if (iVar12 != 0) goto LAB_0156716d;
      }
    }
    else {
LAB_01566b42:
      NextVector(this,state);
      bVar9 = true;
    }
    if (!bVar9) {
      return;
    }
  } while( true );
}

Assistant:

void RowGroup::TemplatedScan(TransactionData transaction, CollectionScanState &state, DataChunk &result) {
	const bool ALLOW_UPDATES = TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_DISALLOW_UPDATES &&
	                           TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED;
	const auto &column_ids = state.GetColumnIds();
	auto &filter_info = state.GetFilterInfo();
	while (true) {
		if (state.vector_index * STANDARD_VECTOR_SIZE >= state.max_row_group_row) {
			// exceeded the amount of rows to scan
			return;
		}
		idx_t current_row = state.vector_index * STANDARD_VECTOR_SIZE;
		auto max_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, state.max_row_group_row - current_row);

		// check the sampling info if we have to sample this chunk
		if (state.GetSamplingInfo().do_system_sample &&
		    state.random.NextRandom() > state.GetSamplingInfo().sample_rate) {
			NextVector(state);
			continue;
		}

		//! first check the zonemap if we have to scan this partition
		if (!CheckZonemapSegments(state)) {
			continue;
		}

		// second, scan the version chunk manager to figure out which tuples to load for this transaction
		idx_t count;
		if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
			count = state.row_group->GetSelVector(transaction, state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else if (TYPE == TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED) {
			count = state.row_group->GetCommittedSelVector(transaction.start_time, transaction.transaction_id,
			                                               state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else {
			count = max_count;
		}
		auto &block_manager = GetBlockManager();
#ifndef DUCKDB_ALTERNATIVE_VERIFY
		// // in regular operation we only prefetch from remote file systems
		// // when alternative verify is set, we always prefetch for testing purposes
		if (block_manager.IsRemote())
#else
		if (!block_manager.InMemory())
#endif
		{
			PrefetchState prefetch_state;
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (!column.IsRowIdColumn()) {
					GetColumn(column).InitializePrefetch(prefetch_state, state.column_scans[i], max_count);
				}
			}
			auto &buffer_manager = block_manager.buffer_manager;
			buffer_manager.Prefetch(prefetch_state.blocks);
		}

		bool has_filters = filter_info.HasFilters();
		if (count == max_count && !has_filters) {
			// scan all vectors completely: full scan without deletions or table filters
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					// scan row id
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].Sequence(UnsafeNumericCast<int64_t>(this->start + current_row), 1, count);
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE != TableScanType::TABLE_SCAN_REGULAR) {
						col_data.ScanCommitted(state.vector_index, state.column_scans[i], result.data[i],
						                       ALLOW_UPDATES);
					} else {
						col_data.Scan(transaction, state.vector_index, state.column_scans[i], result.data[i]);
					}
				}
			}
		} else {
			// partial scan: we have deletions or table filters
			idx_t approved_tuple_count = count;
			SelectionVector sel;
			if (count != max_count) {
				sel.Initialize(state.valid_sel);
			} else {
				sel.Initialize(nullptr);
			}
			//! first, we scan the columns with filters, fetch their data and generate a selection vector.
			//! get runtime statistics
			auto adaptive_filter = filter_info.GetAdaptiveFilter();
			auto filter_state = filter_info.BeginFilter();
			if (has_filters) {
				D_ASSERT(ALLOW_UPDATES);
				auto &filter_list = filter_info.GetFilterList();
				for (idx_t i = 0; i < filter_list.size(); i++) {
					auto filter_idx = adaptive_filter->permutation[i];
					auto &filter = filter_list[filter_idx];
					if (filter.IsAlwaysTrue()) {
						// this filter is always true - skip it
						continue;
					}
					auto &table_filter_state = *filter.filter_state;

					const auto scan_idx = filter.scan_column_index;
					const auto column_idx = filter.table_column_index;

					auto &result_vector = result.data[scan_idx];
					if (column_idx == COLUMN_IDENTIFIER_ROW_ID) {
						// We do another quick statistics scan for row ids here
						const auto rowid_start = this->start + current_row;
						const auto rowid_end = this->start + current_row + max_count;
						const auto prune_result = CheckRowIdFilter(filter.filter, rowid_start, rowid_end);
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_FALSE) {
							// We can just break out of the loop here.
							approved_tuple_count = 0;
							continue;
						}

						// Generate row ids
						// Create sequence for row ids
						D_ASSERT(result_vector.GetType().InternalType() == ROW_TYPE);
						result_vector.SetVectorType(VectorType::FLAT_VECTOR);
						auto result_data = FlatVector::GetData<int64_t>(result_vector);
						for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
							result_data[sel.get_index(sel_idx)] =
							    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
						}

						// Was this filter always true? If so, we dont need to apply it
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
							continue;
						}

						// Now apply the filter
						UnifiedVectorFormat vdata;
						result_vector.ToUnifiedFormat(approved_tuple_count, vdata);
						ColumnSegment::FilterSelection(sel, result_vector, vdata, filter.filter, table_filter_state,
						                               approved_tuple_count, approved_tuple_count);

					} else {
						auto &col_data = GetColumn(filter.table_column_index);
						col_data.Filter(transaction, state.vector_index, state.column_scans[scan_idx], result_vector,
						                sel, approved_tuple_count, filter.filter, table_filter_state);
					}
				}
				for (auto &table_filter : filter_list) {
					if (table_filter.IsAlwaysTrue()) {
						continue;
					}
					result.data[table_filter.scan_column_index].Slice(sel, approved_tuple_count);
				}
			}
			if (approved_tuple_count == 0) {
				// all rows were filtered out by the table filters
				D_ASSERT(has_filters);
				result.Reset();
				// skip this vector in all the scans that were not scanned yet
				for (idx_t i = 0; i < column_ids.size(); i++) {
					auto &col_idx = column_ids[i];
					if (col_idx.IsRowIdColumn()) {
						continue;
					}
					if (has_filters && filter_info.ColumnHasFilters(i)) {
						continue;
					}
					auto &col_data = GetColumn(col_idx);
					col_data.Skip(state.column_scans[i]);
				}
				state.vector_index++;
				continue;
			}
			//! Now we use the selection vector to fetch data for the other columns.
			for (idx_t i = 0; i < column_ids.size(); i++) {
				if (has_filters && filter_info.ColumnHasFilters(i)) {
					// column has already been scanned as part of the filtering process
					continue;
				}
				auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].SetVectorType(VectorType::FLAT_VECTOR);
					auto result_data = FlatVector::GetData<int64_t>(result.data[i]);
					for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
						result_data[sel_idx] =
						    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
					}
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
						col_data.Select(transaction, state.vector_index, state.column_scans[i], result.data[i], sel,
						                approved_tuple_count);
					} else {
						col_data.SelectCommitted(state.vector_index, state.column_scans[i], result.data[i], sel,
						                         approved_tuple_count, ALLOW_UPDATES);
					}
				}
			}
			filter_info.EndFilter(filter_state);

			D_ASSERT(approved_tuple_count > 0);
			count = approved_tuple_count;
		}
		result.SetCardinality(count);
		state.vector_index++;
		break;
	}
}